

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::ValueExpressionBase::fromSymbol
          (ValueExpressionBase *this,ASTContext *context,Symbol *symbol,
          HierarchicalReference *hierRef,SourceRange sourceRange,bool constraintAllowed,
          bool isDottedAccess)

{
  __index_type _Var1;
  ushort uVar2;
  int iVar3;
  ConstantValue *pCVar4;
  Compilation *compilation;
  Scope *node;
  underlying_type uVar5;
  optional<slang::SourceRange> sourceRange_00;
  optional<slang::SourceRange> sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  bool bVar6;
  ConstantValue *pCVar7;
  Type *pTVar8;
  ArbitrarySymbolExpression *pAVar9;
  ASTContext *pAVar10;
  Diagnostic *pDVar11;
  Expression *pEVar12;
  uint uVar13;
  DiagCode code;
  DiagCode code_00;
  undefined8 unaff_R12;
  size_t sVar14;
  char *pcVar15;
  InstanceSymbolBase *inst;
  bool bVar16;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  SourceRange sourceRange_06;
  SourceRange referencingRange;
  string_view arg;
  SourceRange local_80;
  Symbol *local_70;
  HierarchicalReference *local_68;
  SourceLocation SStack_60;
  undefined1 local_58;
  undefined7 uStack_57;
  HierarchicalReference *local_48;
  SourceLocation SStack_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  local_80.endLoc = sourceRange.startLoc;
  pcVar15 = (char *)(ulong)sourceRange.endLoc._0_4_;
  pAVar9 = (ArbitrarySymbolExpression *)CONCAT71((int7)((ulong)unaff_R12 >> 8),constraintAllowed);
  pCVar4 = (this->super_Expression).constant;
  compilation = (Compilation *)**(undefined8 **)&this->super_Expression;
  iVar3 = *(int *)&(context->scope).ptr;
  uVar13 = (uint)pCVar4;
  local_80.startLoc = (SourceLocation)hierRef;
  local_70 = symbol;
  bVar16 = false;
  switch(iVar3) {
  case 0x3b:
switchD_00385757_caseD_3b:
    iVar3 = *(int *)&context[6].scope.ptr[2].nameMap;
    bVar16 = true;
    if (iVar3 == 0xe) {
      code.subsystem = Expressions;
      code.code = 0x58;
      if (((ulong)pCVar4 >> 0x2b & 1) != 0) goto LAB_003859ee;
    }
    else if ((iVar3 == 0xd) && (code.subsystem = Expressions, code.code = 0x5e, -1 < (int)uVar13)) {
LAB_003859ee:
      sourceRange_05.endLoc = local_80.endLoc;
      sourceRange_05.startLoc = (SourceLocation)hierRef;
      pDVar11 = ASTContext::addDiag((ASTContext *)this,code,sourceRange_05);
      Diagnostic::operator<<(pDVar11,*(string_view *)&context->lookupIndex);
      goto LAB_00385a0c;
    }
LAB_00385a4e:
    if (!bVar16) {
      return &pAVar9->super_Expression;
    }
    bVar16 = false;
    pAVar9 = (ArbitrarySymbolExpression *)(ulong)constraintAllowed;
    break;
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x46:
  case 0x47:
  case 0x53:
  case 0x54:
    if (*(int *)&context[6].scope.ptr == 0) {
      if (iVar3 != 0x3f) {
        code.subsystem = Expressions;
        code.code = 0x6b;
        if (((byte)((ulong)pCVar4 >> 0xe) & iVar3 == 0x54) == 0) {
          uVar2 = *(ushort *)((long)&context[6].scope.ptr + 4);
          if (((iVar3 == 0x47) || ((uVar2 & 0x20) != 0)) || (((ulong)pCVar4 & 0x2060) == 0)) {
            code.subsystem = Expressions;
            code.code = 0x47;
            if ((((uVar13 >> 0x19 & 1) == 0 & (byte)((uVar2 & 8) >> 3)) == 0) &&
               ((bVar16 = true,
                (iVar3 != 0x3d || (char)((uVar2 & 0x20) >> 5) != '\0') ||
                ((ulong)pCVar4 >> 0x2a & 1) == 0 ||
                (code.subsystem = Expressions, code.code = 0x91, context[6].lookupIndex != 3))))
            goto LAB_00385a4e;
          }
          else {
            code.subsystem = Expressions;
            code.code = 0x1a;
            if (((ulong)pCVar4 & 0x20) == 0) {
              code = (DiagCode)((uVar13 & 0x40) << 0xb | 0x190007);
            }
          }
        }
        goto LAB_003859ee;
      }
      local_38 = 1;
      sourceRange_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_37;
      sourceRange_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
      sourceRange_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc = local_80.endLoc;
      sourceRange_01.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           (SourceLocation)hierRef;
      local_48 = hierRef;
      SStack_40 = local_80.endLoc;
      bVar16 = Lookup::ensureAccessible((Symbol *)context,(ASTContext *)this,sourceRange_01);
      if (bVar16) {
        bVar16 = true;
        goto LAB_00385a4e;
      }
LAB_00385a0c:
      bVar16 = false;
      pAVar9 = (ArbitrarySymbolExpression *)Expression::badExpr(compilation,(Expression *)0x0);
      goto LAB_00385a4e;
    }
    bVar16 = false;
    if (iVar3 < 0x48) {
      if (iVar3 == 0x27) goto LAB_003858e9;
      if (iVar3 == 0x3b) goto switchD_00385757_caseD_3b;
    }
    else {
      if (iVar3 == 0x53) {
        if (((uVar13 >> 0x14 & 1) == 0) && (context[6].lookupIndex == 1)) {
          sourceRange_04.endLoc = local_80.endLoc;
          sourceRange_04.startLoc = (SourceLocation)hierRef;
          pDVar11 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x400007,sourceRange_04);
          Diagnostic::operator<<(pDVar11,*(string_view *)&context->lookupIndex);
          goto LAB_00385c93;
        }
        goto LAB_003859bc;
      }
      if (iVar3 == 0x4a) goto switchD_00385757_caseD_4a;
      if (iVar3 == 0x48) goto switchD_00385757_caseD_48;
    }
    break;
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x49:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
    break;
  case 0x48:
switchD_00385757_caseD_48:
    if ((context[2].flags.m_bits & 4) == 0) {
      local_58 = 1;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_57;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc = local_80.endLoc;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           (SourceLocation)hierRef;
      local_68 = hierRef;
      SStack_60 = local_80.endLoc;
      Lookup::ensureAccessible((Symbol *)context,(ASTContext *)this,sourceRange_00);
    }
LAB_003859bc:
    bVar16 = false;
    break;
  case 0x4a:
switchD_00385757_caseD_4a:
    if (*(char *)&context[6].scope.ptr != '\x01') goto LAB_003859bc;
    code_00.subsystem = Expressions;
    code_00.code = 0x84;
    goto LAB_00385aad;
  default:
    bVar16 = false;
    if (iVar3 == 0x27) {
LAB_003858e9:
      referencingRange.endLoc = local_80.endLoc;
      referencingRange.startLoc = (SourceLocation)hierRef;
      pCVar7 = ParameterSymbol::getValue((ParameterSymbol *)context,referencingRange);
      _Var1 = *(__index_type *)
               ((long)&(pCVar7->value).
                       super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               + 0x20);
      bVar16 = _Var1 == '\n';
      if ((uVar13 >> 9 & 1) == 0) {
        if (_Var1 == '\n') {
LAB_00385955:
          if (((ulong)(this->super_Expression).constant & 2) == 0) {
            code_00.subsystem = Expressions;
            code_00.code = 0xa1;
            goto LAB_00385aad;
          }
        }
      }
      else if (((byte)((ulong)pCVar4 >> 10) & _Var1 == '\n') != 0) goto LAB_00385955;
      if (((ulong)pCVar4 >> 0x22 & 1) != 0) {
        sourceRange_02.endLoc = local_80.endLoc;
        sourceRange_02.startLoc = local_80.startLoc;
        ASTContext::addDiag((ASTContext *)this,(DiagCode)0xd50007,sourceRange_02);
      }
    }
  }
  bVar6 = Symbol::isValue((Symbol *)context);
  if (!bVar6) {
    iVar3 = *(int *)&(context->scope).ptr;
    if (((iVar3 == 0x48 & sourceRange.endLoc._0_1_) != 0 ||
         ((byte)((ulong)pCVar4 >> 0x11) & 1 & iVar3 == 0x52) != 0) ||
       (((byte)((ulong)pCVar4 >> 0x18) >> 2 & 1 & iVar3 == 0x5b) == 1)) {
      pAVar9 = BumpAllocator::
               emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference_const*&,slang::SourceRange&>
                         ((BumpAllocator *)compilation,*(Scope **)&this->super_Expression,
                          (Symbol *)context,compilation->voidType,
                          (HierarchicalReference **)&local_70,&local_80);
      return &pAVar9->super_Expression;
    }
    if (*(size_t *)&context->lookupIndex == 0) {
      if ((iVar3 == 0x2f) || (iVar3 == 0x57)) {
        arg = InstanceSymbolBase::getArrayName((InstanceSymbolBase *)context);
      }
      else {
        sVar14 = 0;
        pAVar10 = context;
        do {
          if (*(int *)&(pAVar10->scope).ptr != 0x37) {
            arg = *(string_view *)&pAVar10->lookupIndex;
            break;
          }
          uVar5 = pAVar10[2].flags.m_bits;
          if (uVar5 == 0) {
            sVar14 = *(size_t *)&pAVar10->lookupIndex;
            pcVar15 = (char *)(pAVar10->flags).m_bits;
          }
          else {
            pAVar10 = (ASTContext *)
                      (pAVar10->firstTempVar->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                      name._M_len;
          }
          arg._M_str = pcVar15;
          arg._M_len = sVar14;
        } while (uVar5 != 0);
      }
    }
    else {
      arg._M_str = (char *)(context->flags).m_bits;
      arg._M_len = *(size_t *)&context->lookupIndex;
    }
    if (arg._M_len != 0) {
      sourceRange_03.endLoc = local_80.endLoc;
      sourceRange_03.startLoc = local_80.startLoc;
      pDVar11 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x25000a,sourceRange_03);
      pDVar11 = Diagnostic::operator<<(pDVar11,arg);
      Diagnostic::addNote(pDVar11,(DiagCode)0x50001,(SourceLocation)context->instanceOrProc);
    }
LAB_00385c93:
    pEVar12 = Expression::badExpr(compilation,(Expression *)0x0);
    return pEVar12;
  }
  if ((uVar13 >> 0x10 & 1) != 0) {
    pTVar8 = DeclaredType::getType((DeclaredType *)&context[1].lookupIndex);
    if (pTVar8->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar8);
    }
    if ((pTVar8->canonical->super_Symbol).kind == CHandleType) {
      code_00.subsystem = Expressions;
      code_00.code = 0x35;
LAB_00385aad:
      sourceRange_06.endLoc = local_80.endLoc;
      sourceRange_06.startLoc = local_80.startLoc;
      ASTContext::addDiag((ASTContext *)this,code_00,sourceRange_06);
      goto LAB_00385c93;
    }
  }
  node = context[1].scope.ptr;
  if (((uint)((ulong)pCVar4 >> 0x27) & 1) != 0 || node == (Scope *)0x0) goto LAB_00385b99;
  if ((char)pAVar9 == '\0') {
LAB_00385b63:
    Compilation::noteReference
              (compilation,(SyntaxNode *)node,(bool)((byte)((ulong)pCVar4 >> 0x14) & 1));
    if ((~(ulong)pCVar4 & 0x4000100000) != 0) goto LAB_00385b99;
  }
  else {
    pTVar8 = DeclaredType::getType((DeclaredType *)&context[1].lookupIndex);
    if (pTVar8->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar8);
    }
    if (((pTVar8->canonical->super_Symbol).kind != ClassType) &&
       ((pTVar8->canonical->super_Symbol).kind != CovergroupType)) goto LAB_00385b63;
  }
  Compilation::noteReference(compilation,(SyntaxNode *)node,false);
LAB_00385b99:
  if ((local_70 == (Symbol *)0x0) || (*(long *)local_70 == 0)) {
    pAVar9 = (ArbitrarySymbolExpression *)
             BumpAllocator::
             emplace<slang::ast::NamedValueExpression,slang::ast::ValueSymbol_const&,slang::SourceRange&>
                       ((BumpAllocator *)compilation,(ValueSymbol *)context,&local_80);
  }
  else {
    pAVar9 = (ArbitrarySymbolExpression *)
             BumpAllocator::
             emplace<slang::ast::HierarchicalValueExpression,slang::ast::Scope_const&,slang::ast::ValueSymbol_const&,slang::ast::HierarchicalReference_const&,slang::SourceRange&>
                       ((BumpAllocator *)compilation,*(Scope **)&this->super_Expression,
                        (ValueSymbol *)context,(HierarchicalReference *)local_70,&local_80);
  }
  if (bVar16) {
    pTVar8 = Compilation::getUnboundedType(compilation);
    (pAVar9->super_Expression).type.ptr = pTVar8;
  }
  return &pAVar9->super_Expression;
}

Assistant:

Expression& ValueExpressionBase::fromSymbol(const ASTContext& context, const Symbol& symbol,
                                            const HierarchicalReference* hierRef,
                                            SourceRange sourceRange, bool constraintAllowed,
                                            bool isDottedAccess) {
    // Automatic variables have additional restrictions.
    bool isUnbounded = false;
    auto& comp = context.getCompilation();
    auto flags = context.flags;
    if (VariableSymbol::isKind(symbol.kind) &&
        symbol.as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {

        // If this is actually a class property, check that no static methods,
        // initializers, or nested classes are accessing it.
        auto& var = symbol.as<VariableSymbol>();
        if (symbol.kind == SymbolKind::ClassProperty) {
            if (!Lookup::ensureAccessible(symbol, context, sourceRange))
                return badExpr(comp, nullptr);
        }
        else if (flags.has(ASTFlags::EventExpression) &&
                 symbol.kind == SymbolKind::LocalAssertionVar) {
            context.addDiag(diag::LocalVarEventExpr, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }
        else if (!var.flags.has(VariableFlags::RefStatic) && flags.has(DisallowedAutoVarContexts) &&
                 var.kind != SymbolKind::PatternVar) {
            if (flags.has(ASTFlags::NonProcedural)) {
                context.addDiag(diag::AutoFromNonProcedural, sourceRange) << symbol.name;
                return badExpr(comp, nullptr);
            }
            else if (flags.has(ASTFlags::StaticInitializer)) {
                context.addDiag(diag::AutoFromStaticInit, sourceRange) << symbol.name;
                return badExpr(comp, nullptr);
            }
            else if (flags.has(ASTFlags::NonBlockingTimingControl)) {
                context.addDiag(diag::AutoFromNonBlockingTiming, sourceRange) << symbol.name;
                return badExpr(comp, nullptr);
            }
            else {
                SLANG_UNREACHABLE;
            }
        }
        else if (!flags.has(ASTFlags::AllowCoverageSampleFormal) &&
                 var.flags.has(VariableFlags::CoverageSampleFormal)) {
            context.addDiag(diag::CoverageSampleFormal, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }
        else if (flags.has(ASTFlags::ForkJoinAnyNone) && !var.flags.has(VariableFlags::RefStatic) &&
                 symbol.kind == SymbolKind::FormalArgument &&
                 symbol.as<FormalArgumentSymbol>().direction == ArgumentDirection::Ref) {
            // Can't refer to ref args in fork-join_any/none
            context.addDiag(diag::RefArgForkJoin, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }
    }
    else if (symbol.kind == SymbolKind::ConstraintBlock) {
        if (!symbol.as<ConstraintBlockSymbol>().flags.has(ConstraintBlockFlags::Static))
            Lookup::ensureAccessible(symbol, context, sourceRange);
    }
    else if (symbol.kind == SymbolKind::Parameter) {
        // A note on the flags check: parameters with an unbounded value are allowed
        // anywhere that an unbounded literal is allowed, *except* for queue expressions,
        // which is indicated here by the AllowUnboundedLiteralArithmetic flag.
        isUnbounded = symbol.as<ParameterSymbol>().getValue(sourceRange).isUnbounded();
        if ((!flags.has(ASTFlags::AllowUnboundedLiteral) ||
             flags.has(ASTFlags::AllowUnboundedLiteralArithmetic)) &&
            isUnbounded && !context.inUnevaluatedBranch()) {
            context.addDiag(diag::UnboundedNotAllowed, sourceRange);
            return badExpr(comp, nullptr);
        }

        if (flags.has(ASTFlags::SpecifyBlock))
            context.addDiag(diag::SpecifyBlockParam, sourceRange);
    }
    else if (symbol.kind == SymbolKind::Net) {
        auto& netType = symbol.as<NetSymbol>().netType;
        if (netType.netKind == NetType::Interconnect && !flags.has(ASTFlags::AllowInterconnect)) {
            context.addDiag(diag::InterconnectReference, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }

        if (netType.netKind == NetType::UserDefined && flags.has(ASTFlags::DisallowUDNT)) {
            context.addDiag(diag::GateUDNTConn, sourceRange) << symbol.name;
            return badExpr(comp, nullptr);
        }
    }
    else if (symbol.kind == SymbolKind::ClockVar && !flags.has(ASTFlags::LValue) &&
             symbol.as<ClockVarSymbol>().direction == ArgumentDirection::Out) {
        context.addDiag(diag::ClockVarOutputRead, sourceRange) << symbol.name;
        return badExpr(comp, nullptr);
    }
    else if (symbol.kind == SymbolKind::Specparam && symbol.as<SpecparamSymbol>().isPathPulse) {
        context.addDiag(diag::PathPulseInExpr, sourceRange);
        return badExpr(comp, nullptr);
    }

    if (!symbol.isValue()) {
        if ((symbol.kind == SymbolKind::ClockingBlock && flags.has(ASTFlags::AllowClockingBlock)) ||
            (symbol.kind == SymbolKind::ConstraintBlock && constraintAllowed) ||
            (symbol.kind == SymbolKind::Coverpoint && flags.has(ASTFlags::AllowCoverpoint))) {
            // Special case for event expressions and constraint block built-in methods.
            return *comp.emplace<ArbitrarySymbolExpression>(*context.scope, symbol,
                                                            comp.getVoidType(), hierRef,
                                                            sourceRange);
        }

        // It's possible for the name to be empty here in cases
        // where we looked up something like a generic class type
        // and there was some error in resolving it to a real type,
        // in which case `symbol` will be the ErrorType with an empty name.
        auto name = getNonValueName(symbol);
        if (!name.empty()) {
            auto& diag = context.addDiag(diag::NotAValue, sourceRange) << name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
        }
        return badExpr(comp, nullptr);
    }

    // chandles can't be referenced in sequence expressions
    auto& value = symbol.as<ValueSymbol>();
    if (flags.has(ASTFlags::AssertionExpr) && value.getType().isCHandle()) {
        context.addDiag(diag::CHandleInAssertion, sourceRange);
        return badExpr(comp, nullptr);
    }

    if (auto syntax = symbol.getSyntax(); syntax && !flags.has(ASTFlags::NoReference)) {
        bool isLValue = flags.has(ASTFlags::LValue);
        if (isDottedAccess) {
            auto& type = value.getType();
            if (type.isClass() || type.isCovergroup())
                isLValue = false;
        }

        comp.noteReference(*syntax, isLValue);

        if (isLValue && flags.has(ASTFlags::LAndRValue))
            comp.noteReference(*syntax, /* isLValue */ false);
    }

    Expression* result;
    if (hierRef && hierRef->target) {
        result = comp.emplace<HierarchicalValueExpression>(*context.scope, value, *hierRef,
                                                           sourceRange);
    }
    else {
        result = comp.emplace<NamedValueExpression>(value, sourceRange);
    }

    if (isUnbounded)
        result->type = &comp.getUnboundedType();
    return *result;
}